

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O0

bool __thiscall cmListFileArgument::operator==(cmListFileArgument *this,cmListFileArgument *r)

{
  __type _Var1;
  bool local_19;
  cmListFileArgument *r_local;
  cmListFileArgument *this_local;
  
  _Var1 = std::operator==(&this->Value,&r->Value);
  local_19 = false;
  if (_Var1) {
    local_19 = this->Delim == r->Delim;
  }
  return local_19;
}

Assistant:

bool operator==(const cmListFileArgument& r) const
  {
    return (this->Value == r.Value) && (this->Delim == r.Delim);
  }